

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int convert_RGB_to_YCoCg(uchar *orig,int width,int height,int channels)

{
  uchar uVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  int tmp_1;
  uchar a;
  int b_1;
  int g_1;
  int r_1;
  int tmp;
  int b;
  int g;
  int r;
  int i;
  int channels_local;
  int height_local;
  int width_local;
  uchar *orig_local;
  
  if ((((width < 1) || (height < 1)) || (channels < 3)) ||
     ((4 < channels || (orig == (uchar *)0x0)))) {
    orig_local._4_4_ = -1;
  }
  else {
    if (channels == 3) {
      for (g = 0; SBORROW4(g,width * height * 3) != g + width * height * -3 < 0; g = g + 3) {
        iVar3 = (int)(orig[g + 1] + 1) >> 1;
        iVar4 = (int)(orig[g] + 2 + (uint)orig[g + 2]) >> 2;
        uVar1 = clamp_byte(((int)(((uint)orig[g] - (uint)orig[g + 2]) + 1) >> 1) + 0x80);
        orig[g] = uVar1;
        uVar1 = clamp_byte(iVar3 + iVar4);
        orig[g + 1] = uVar1;
        uVar1 = clamp_byte((iVar3 + 0x80) - iVar4);
        orig[g + 2] = uVar1;
      }
    }
    else {
      for (g = 0; g < width * height * 4; g = g + 4) {
        iVar3 = (int)(orig[g + 1] + 1) >> 1;
        uVar1 = orig[g + 3];
        iVar4 = (int)(orig[g] + 2 + (uint)orig[g + 2]) >> 2;
        uVar2 = clamp_byte(((int)(((uint)orig[g] - (uint)orig[g + 2]) + 1) >> 1) + 0x80);
        orig[g] = uVar2;
        uVar2 = clamp_byte((iVar3 + 0x80) - iVar4);
        orig[g + 1] = uVar2;
        orig[g + 2] = uVar1;
        uVar1 = clamp_byte(iVar3 + iVar4);
        orig[g + 3] = uVar1;
      }
    }
    orig_local._4_4_ = 0;
  }
  return orig_local._4_4_;
}

Assistant:

int
	convert_RGB_to_YCoCg
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int r = orig[i+0];
			int g = (orig[i+1] + 1) >> 1;
			int b = orig[i+2];
			int tmp = (2 + r + b) >> 2;
			/*	Co	*/
			orig[i+0] = clamp_byte( 128 + ((r - b + 1) >> 1) );
			/*	Y	*/
			orig[i+1] = clamp_byte( g + tmp );
			/*	Cg	*/
			orig[i+2] = clamp_byte( 128 + g - tmp );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int r = orig[i+0];
			int g = (orig[i+1] + 1) >> 1;
			int b = orig[i+2];
			unsigned char a = orig[i+3];
			int tmp = (2 + r + b) >> 2;
			/*	Co	*/
			orig[i+0] = clamp_byte( 128 + ((r - b + 1) >> 1) );
			/*	Cg	*/
			orig[i+1] = clamp_byte( 128 + g - tmp );
			/*	Alpha	*/
			orig[i+2] = a;
			/*	Y	*/
			orig[i+3] = clamp_byte( g + tmp );
		}
	}
	/*	done	*/
	return 0;
}